

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findMetadataVariableNames.cpp
# Opt level: O1

void findMetadataVariableNames(Module *module,Program *program)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BasicBlock *pBVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  Module *pMVar6;
  long lVar7;
  Expr *expr;
  Expr *pEVar8;
  char *pcVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  long extraout_RDX;
  Function *pFVar13;
  char cVar14;
  Function *pFVar15;
  BasicBlock *pBVar16;
  char *pcVar17;
  ulong __val;
  undefined1 auVar18 [16];
  string name;
  key_type local_a8;
  key_type local_88;
  Program *local_68;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_60;
  Block *local_58;
  Module *local_50;
  Module *local_48;
  Function *local_40;
  Func *local_38;
  
  pMVar6 = *(Module **)(module + 0x20);
  local_50 = module + 0x18;
  local_68 = program;
  if (pMVar6 != local_50) {
    do {
      pFVar13 = (Function *)(pMVar6 + -0x38);
      if (pMVar6 == (Module *)0x0) {
        pFVar13 = (Function *)0x0;
      }
      local_48 = pMVar6;
      local_38 = Program::getFunction(local_68,pFVar13);
      pFVar15 = *(Function **)(pFVar13 + 0x50);
      local_40 = pFVar13 + 0x48;
      if (pFVar15 != local_40) {
        do {
          pFVar13 = pFVar15 + -0x18;
          if (pFVar15 == (Function *)0x0) {
            pFVar13 = (Function *)0x0;
          }
          local_58 = Func::getBlock(local_38,(BasicBlock *)pFVar13);
          for (pBVar2 = *(BasicBlock **)((BasicBlock *)pFVar13 + 0x30);
              pBVar2 != (BasicBlock *)pFVar13 + 0x28; pBVar2 = *(BasicBlock **)(pBVar2 + 8)) {
            pBVar16 = pBVar2 + -0x18;
            if (pBVar2 == (BasicBlock *)0x0) {
              pBVar16 = (BasicBlock *)0x0;
            }
            if (pBVar16[0x10] == (BasicBlock)0x53) {
              lVar7 = *(long *)(pBVar16 + -0x20);
              if (lVar7 == 0) {
                lVar7 = 0;
              }
              else if (*(char *)(lVar7 + 0x10) != '\0') {
                lVar7 = 0;
              }
              if ((lVar7 != 0) && (*(long *)(lVar7 + 0x18) == *(long *)(pBVar16 + 0x48))) {
                auVar18 = llvm::Value::getName();
                lVar7 = auVar18._0_8_;
                paVar1 = &local_a8.field_2;
                local_a8._M_dataplus._M_p = (pointer)paVar1;
                if (lVar7 == 0) {
                  local_a8._M_string_length = 0;
                  local_a8.field_2._M_local_buf[0] = '\0';
                }
                else {
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_a8,lVar7,auVar18._8_8_ + lVar7);
                }
                iVar5 = std::__cxx11::string::compare((char *)&local_a8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                           local_a8.field_2._M_local_buf[0]) + 1);
                }
                if (iVar5 == 0) {
                  lVar7 = *(long *)(pBVar16 + -(ulong)(uint)(*(int *)(pBVar16 + 0x14) << 5));
                  if (*(char *)(lVar7 + 0x10) != '\x16') {
                    lVar7 = 0;
                  }
                  expr = Func::getExpr(local_58->func,*(Value **)(*(long *)(lVar7 + 0x18) + 0x80));
                  pEVar8 = (Expr *)0x0;
                  if ((expr != (Expr *)0x0) &&
                     (bVar4 = RefExpr::classof(expr), pEVar8 = expr, !bVar4)) {
                    pEVar8 = (Expr *)0x0;
                  }
                  if (pEVar8 != (Expr *)0x0) {
                    expr = *(Expr **)&pEVar8[1].kind;
                  }
                  if (expr == (Expr *)0x0) {
                    expr = (Expr *)0x0;
                  }
                  else {
                    bVar4 = Value::classof(expr);
                    if (!bVar4) {
                      expr = (Expr *)0x0;
                    }
                  }
                  if (expr != (Expr *)0x0) {
                    pcVar9 = *(char **)(pBVar16 +
                                       (0x20 - (ulong)(uint)(*(int *)(pBVar16 + 0x14) << 5)));
                    if ((*(char **)(pBVar16 + (0x20 - (ulong)(uint)(*(int *)(pBVar16 + 0x14) << 5)))
                        )[0x10] != '\x16') {
                      pcVar9 = (char *)0x0;
                    }
                    pcVar9 = *(char **)(pcVar9 + 0x18);
                    pcVar17 = (char *)0x0;
                    if ((pcVar9 != (char *)0x0) && (pcVar17 = pcVar9, *pcVar9 != '\x19')) {
                      pcVar17 = (char *)0x0;
                    }
                    if ((*(long *)(pcVar17 + (ulong)*(uint *)(pcVar17 + 8) * -8 + 8) != 0) &&
                       (llvm::MDString::getString(), extraout_RDX != 0)) {
                      local_60 = &(local_58->func->variableCounters)._M_h;
                      if (*(long *)(pcVar17 + (ulong)*(uint *)(pcVar17 + 8) * -8 + 8) == 0) {
                        auVar18 = ZEXT816(0);
                      }
                      else {
                        auVar18 = llvm::MDString::getString();
                      }
                      lVar7 = auVar18._0_8_;
                      if (lVar7 == 0) {
                        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                        local_a8._M_string_length = 0;
                        local_a8.field_2._M_local_buf[0] = '\0';
                      }
                      else {
                        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_a8,lVar7,auVar18._8_8_ + lVar7);
                      }
                      iVar10 = std::
                               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               ::find(local_60,&local_a8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                        operator_delete(local_a8._M_dataplus._M_p,
                                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                                 local_a8.field_2._M_local_buf[0]) + 1);
                      }
                      if (*(long *)(pcVar17 + (ulong)*(uint *)(pcVar17 + 8) * -8 + 8) == 0) {
                        auVar18 = ZEXT816(0);
                      }
                      else {
                        auVar18 = llvm::MDString::getString();
                      }
                      lVar7 = auVar18._0_8_;
                      if (lVar7 == 0) {
                        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                        local_a8._M_string_length = 0;
                        local_a8.field_2._M_local_buf[0] = '\0';
                      }
                      else {
                        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_a8,lVar7,auVar18._8_8_ + lVar7);
                      }
                      if (iVar10.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                          ._M_cur == (__node_type *)0x0) {
                        if (*(long *)(pcVar17 + (ulong)*(uint *)(pcVar17 + 8) * -8 + 8) == 0) {
                          auVar18 = ZEXT816(0);
                        }
                        else {
                          auVar18 = llvm::MDString::getString();
                        }
                        lVar7 = auVar18._0_8_;
                        if (lVar7 == 0) {
                          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                          local_88._M_string_length = 0;
                          local_88.field_2._M_local_buf[0] = '\0';
                        }
                        else {
                          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_88,lVar7,auVar18._8_8_ + lVar7);
                        }
                        pmVar11 = std::__detail::
                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                *)local_60,&local_88);
                        *pmVar11 = 1;
                      }
                      else {
                        __val = *(long *)((long)iVar10.
                                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                                ._M_cur + 0x28) + 1;
                        *(ulong *)((long)iVar10.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                         ._M_cur + 0x28) = __val;
                        cVar14 = '\x01';
                        if (9 < __val) {
                          uVar12 = __val;
                          cVar3 = '\x04';
                          do {
                            cVar14 = cVar3;
                            if (uVar12 < 100) {
                              cVar14 = cVar14 + -2;
                              goto LAB_0015a505;
                            }
                            if (uVar12 < 1000) {
                              cVar14 = cVar14 + -1;
                              goto LAB_0015a505;
                            }
                            if (uVar12 < 10000) goto LAB_0015a505;
                            bVar4 = 99999 < uVar12;
                            uVar12 = uVar12 / 10000;
                            cVar3 = cVar14 + '\x04';
                          } while (bVar4);
                          cVar14 = cVar14 + '\x01';
                        }
LAB_0015a505:
                        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                        std::__cxx11::string::_M_construct((ulong)&local_88,cVar14);
                        std::__detail::__to_chars_10_impl<unsigned_long>
                                  (local_88._M_dataplus._M_p,(uint)local_88._M_string_length,__val);
                        std::__cxx11::string::_M_append
                                  ((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_88._M_dataplus._M_p != &local_88.field_2) {
                        operator_delete(local_88._M_dataplus._M_p,
                                        CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                                                 local_88.field_2._M_local_buf[0]) + 1);
                      }
                      std::__cxx11::string::_M_assign((string *)&expr[1].kind);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                        operator_delete(local_a8._M_dataplus._M_p,
                                        CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                                 local_a8.field_2._M_local_buf[0]) + 1);
                      }
                    }
                  }
                }
              }
            }
          }
          pFVar15 = *(Function **)(pFVar15 + 8);
        } while (pFVar15 != local_40);
      }
      pMVar6 = *(Module **)(local_48 + 8);
    } while (pMVar6 != local_50);
  }
  Program::addPass(local_68,FindMetadataVariableNames);
  return;
}

Assistant:

void findMetadataVariableNames(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateAllocas));

    for (const auto& function : module->functions()) {
        auto* func = program.getFunction(&function);
        for (const auto& block : function) {
            auto* myBlock = func->getBlock(&block);

            for (const auto& ins : block) {
                if (ins.getOpcode() == llvm::Instruction::Call) {
                    const llvm::CallInst* CI = llvm::cast<llvm::CallInst>(&ins);
                    if (CI->getCalledFunction()) {
                        if (CI->getCalledFunction()->getName().str().compare("llvm.dbg.declare") == 0) {
                            setMetadataInfo(CI, myBlock);
                        }
                    }
                }
            }

        }
    }

    program.addPass(PassType::FindMetadataVariableNames);
}